

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O1

int __thiscall ncnn::Crop::load_param(Crop *this,ParamDict *pd)

{
  Mat *pMVar1;
  int *piVar2;
  void *pvVar3;
  Allocator *pAVar4;
  int iVar5;
  Mat *def;
  bool bVar6;
  undefined1 auVar7 [16];
  Mat local_c8;
  Mat local_78;
  
  iVar5 = ParamDict::get(pd,0,0);
  this->woffset = iVar5;
  iVar5 = ParamDict::get(pd,1,0);
  this->hoffset = iVar5;
  iVar5 = ParamDict::get(pd,0xd,0);
  this->doffset = iVar5;
  iVar5 = ParamDict::get(pd,2,0);
  this->coffset = iVar5;
  iVar5 = ParamDict::get(pd,3,0);
  this->outw = iVar5;
  iVar5 = ParamDict::get(pd,4,0);
  this->outh = iVar5;
  iVar5 = ParamDict::get(pd,0xe,0);
  this->outd = iVar5;
  iVar5 = ParamDict::get(pd,5,0);
  this->outc = iVar5;
  iVar5 = ParamDict::get(pd,6,0);
  this->woffset2 = iVar5;
  iVar5 = ParamDict::get(pd,7,0);
  this->hoffset2 = iVar5;
  iVar5 = ParamDict::get(pd,0xf,0);
  this->doffset2 = iVar5;
  iVar5 = ParamDict::get(pd,8,0);
  this->coffset2 = iVar5;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  ParamDict::get(&local_c8,pd,9,&local_78);
  pMVar1 = &this->starts;
  if (pMVar1 != &local_c8) {
    piVar2 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (this->starts).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = (this->starts).data;
        pAVar4 = (this->starts).allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (**(code **)(*(long *)pAVar4 + 0x18))();
        }
      }
    }
    (this->starts).cstep = 0;
    *(undefined8 *)((long)&(this->starts).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->starts).elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->starts).refcount = (int *)0x0;
    (this->starts).dims = 0;
    (this->starts).w = 0;
    (this->starts).h = 0;
    (this->starts).d = 0;
    (this->starts).c = 0;
    (this->starts).data = local_c8.data;
    (this->starts).refcount = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    (this->starts).elemsize = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
    (this->starts).elempack = local_c8.elempack;
    (this->starts).allocator = local_c8.allocator;
    (this->starts).dims = local_c8.dims;
    (this->starts).w = local_c8.w;
    (this->starts).h = local_c8.h;
    (this->starts).d = local_c8.d;
    (this->starts).c = local_c8.c;
    (this->starts).cstep = local_c8.cstep;
  }
  piVar2 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_c8.allocator + 0x18))();
      }
    }
  }
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  piVar2 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (**(code **)(*(long *)local_78.allocator + 0x18))();
      }
    }
  }
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  ParamDict::get(&local_c8,pd,10,&local_78);
  if (&this->ends != &local_c8) {
    piVar2 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (this->ends).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = (this->ends).data;
        pAVar4 = (this->ends).allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (**(code **)(*(long *)pAVar4 + 0x18))();
        }
      }
    }
    (this->ends).cstep = 0;
    *(undefined8 *)((long)&(this->ends).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->ends).elemsize + 4) = 0;
    (this->ends).data = (void *)0x0;
    (this->ends).refcount = (int *)0x0;
    (this->ends).dims = 0;
    (this->ends).w = 0;
    (this->ends).h = 0;
    (this->ends).d = 0;
    (this->ends).c = 0;
    (this->ends).data = local_c8.data;
    (this->ends).refcount = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    (this->ends).elemsize = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
    (this->ends).elempack = local_c8.elempack;
    (this->ends).allocator = local_c8.allocator;
    (this->ends).dims = local_c8.dims;
    (this->ends).w = local_c8.w;
    (this->ends).h = local_c8.h;
    (this->ends).d = local_c8.d;
    (this->ends).c = local_c8.c;
    (this->ends).cstep = local_c8.cstep;
  }
  piVar2 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_c8.allocator + 0x18))();
      }
    }
  }
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  piVar2 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (**(code **)(*(long *)local_78.allocator + 0x18))();
      }
    }
  }
  def = &local_78;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  ParamDict::get(&local_c8,pd,0xb,def);
  if (&this->axes != &local_c8) {
    piVar2 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (this->axes).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = (this->axes).data;
        pAVar4 = (this->axes).allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (**(code **)(*(long *)pAVar4 + 0x18))();
        }
      }
    }
    (this->axes).cstep = 0;
    *(undefined8 *)((long)&(this->axes).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->axes).elemsize + 4) = 0;
    (this->axes).data = (void *)0x0;
    (this->axes).refcount = (int *)0x0;
    (this->axes).dims = 0;
    (this->axes).w = 0;
    (this->axes).h = 0;
    (this->axes).d = 0;
    (this->axes).c = 0;
    (this->axes).data = local_c8.data;
    (this->axes).refcount = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    (this->axes).elemsize = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
    (this->axes).elempack = local_c8.elempack;
    (this->axes).allocator = local_c8.allocator;
    (this->axes).dims = local_c8.dims;
    (this->axes).w = local_c8.w;
    (this->axes).h = local_c8.h;
    (this->axes).d = local_c8.d;
    (this->axes).c = local_c8.c;
    (this->axes).cstep = local_c8.cstep;
  }
  piVar2 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_c8.allocator + 0x18))();
      }
    }
  }
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  piVar2 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (**(code **)(*(long *)local_78.allocator + 0x18))();
      }
    }
  }
  if (pMVar1->data == (void *)0x0) {
    bVar6 = false;
  }
  else {
    def = (Mat *)((long)(this->starts).c * (this->starts).cstep);
    bVar6 = false;
    if ((def != (Mat *)0x0) && ((this->ends).data != (void *)0x0)) {
      bVar6 = (long)(this->ends).c * (this->ends).cstep != 0;
    }
  }
  auVar7._0_4_ = -(uint)(this->woffset2 == 0 && this->outw == 0);
  auVar7._4_4_ = -(uint)(this->hoffset2 == 0 && this->outh == 0);
  auVar7._8_4_ = -(uint)(this->doffset2 == 0 && this->outd == 0);
  auVar7._12_4_ = -(uint)(this->coffset2 == 0 && this->outc == 0);
  iVar5 = movmskps((int)def,auVar7);
  if ((iVar5 == 0xf) && (!bVar6)) {
    (this->super_Layer).one_blob_only = false;
  }
  return 0;
}

Assistant:

int Crop::load_param(const ParamDict& pd)
{
    woffset = pd.get(0, 0);
    hoffset = pd.get(1, 0);
    doffset = pd.get(13, 0);
    coffset = pd.get(2, 0);
    outw = pd.get(3, 0);
    outh = pd.get(4, 0);
    outd = pd.get(14, 0);
    outc = pd.get(5, 0);
    woffset2 = pd.get(6, 0);
    hoffset2 = pd.get(7, 0);
    doffset2 = pd.get(15, 0);
    coffset2 = pd.get(8, 0);

    starts = pd.get(9, Mat());
    ends = pd.get(10, Mat());
    axes = pd.get(11, Mat());

    bool numpy_style_slice = !starts.empty() && !ends.empty();

    if (outw == 0 && outh == 0 && outd == 0 && outc == 0 && woffset2 == 0 && hoffset2 == 0 && doffset2 == 0 && coffset2 == 0 && !numpy_style_slice)
    {
        one_blob_only = false;
    }

    return 0;
}